

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O1

bool __thiscall
libcellml::Variable::VariableImpl::hasEquivalentVariable
          (VariableImpl *this,VariablePtr *equivalentVariable,bool considerIndirectEquivalences)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  bool bVar2;
  const_iterator cVar3;
  undefined3 in_register_00000011;
  
  if (CONCAT31(in_register_00000011,considerIndirectEquivalences) != 0) {
    bVar2 = hasIndirectEquivalentVariable(this,equivalentVariable);
    return bVar2;
  }
  cVar3 = findEquivalentVariable(this,equivalentVariable);
  if ((cVar3._M_current ==
       (this->mEquivalentVariables).
       super__Vector_base<std::weak_ptr<libcellml::Variable>,_std::allocator<std::weak_ptr<libcellml::Variable>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) ||
     (p_Var1 = ((cVar3._M_current)->
               super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi,
     p_Var1 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
    bVar2 = false;
  }
  else {
    bVar2 = p_Var1->_M_use_count != 0;
  }
  return bVar2;
}

Assistant:

bool Variable::VariableImpl::hasEquivalentVariable(const VariablePtr &equivalentVariable, bool considerIndirectEquivalences) const
{
    bool equivalent = false;
    if (considerIndirectEquivalences) {
        equivalent = hasIndirectEquivalentVariable(equivalentVariable);
    } else {
        auto it = findEquivalentVariable(equivalentVariable);
        if (it == mEquivalentVariables.end()) {
            return false;
        }
        equivalent = !it->expired();
    }

    return equivalent;
}